

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char *path)

{
  bool bVar1;
  WorkingMode WVar2;
  char *pcVar3;
  cmMakefile *pcVar4;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool collapse_02;
  bool bVar5;
  allocator local_1d9;
  string local_1d8;
  undefined1 local_1b8 [8];
  string file;
  auto_ptr<cmMakefile> mf;
  cmStateDirectory local_170;
  string local_148;
  cmStateDirectory local_128;
  undefined1 local_100 [8];
  cmStateSnapshot snapshot;
  string local_c8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string homeOutputDir;
  undefined1 local_78 [8];
  string homeDir;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_50;
  PositionType local_48;
  cmGlobalGenerator *pcStack_28;
  bool created;
  cmGlobalGenerator *gg;
  char *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  pcStack_28 = GetGlobalGenerator(this);
  bVar5 = pcStack_28 == (cmGlobalGenerator *)0x0;
  if (bVar5) {
    pcStack_28 = (cmGlobalGenerator *)operator_new(0x5c8);
    cmGlobalGenerator::cmGlobalGenerator(pcStack_28,this);
  }
  if (path != (char *)0x0) {
    cmState::Reset((cmStateSnapshot *)((long)&homeDir.field_2 + 8),this->State);
    (this->CurrentSnapshot).Position.Position = local_48;
    (this->CurrentSnapshot).State = (cmState *)homeDir.field_2._8_8_;
    (this->CurrentSnapshot).Position.Tree = pcStack_50;
    pcVar3 = GetHomeDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_78,pcVar3,(allocator *)(homeOutputDir.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(homeOutputDir.field_2._M_local_buf + 0xf));
    pcVar3 = GetHomeOutputDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a0,pcVar3,&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_c8,(SystemTools *)0x1,collapse)
    ;
    SetHomeDirectory(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&snapshot.Position.Position,(SystemTools *)0x1,collapse_00);
    SetHomeOutputDirectory(this,(string *)&snapshot.Position.Position);
    std::__cxx11::string::~string((string *)&snapshot.Position.Position);
    GetCurrentSnapshot((cmStateSnapshot *)local_100,this);
    cmStateSnapshot::GetDirectory(&local_128,(cmStateSnapshot *)local_100);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_148,(SystemTools *)0x1,collapse_01);
    cmStateDirectory::SetCurrentBinary(&local_128,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    cmStateSnapshot::GetDirectory(&local_170,(cmStateSnapshot *)local_100);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&mf,(SystemTools *)0x1,collapse_02);
    cmStateDirectory::SetCurrentSource(&local_170,(string *)&mf);
    std::__cxx11::string::~string((string *)&mf);
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_100);
    pcVar4 = (cmMakefile *)operator_new(0x760);
    cmMakefile::cmMakefile(pcVar4,pcStack_28,(cmStateSnapshot *)local_100);
    ::cm::auto_ptr<cmMakefile>::auto_ptr((auto_ptr<cmMakefile> *)((long)&file.field_2 + 8),pcVar4);
    WVar2 = GetWorkingMode(this);
    if (WVar2 != NORMAL_MODE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,path,&local_1d9);
      cmsys::SystemTools::CollapseFullPath((string *)local_1b8,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1b8);
      pcVar4 = ::cm::auto_ptr<cmMakefile>::operator->
                         ((auto_ptr<cmMakefile> *)((long)&file.field_2 + 8));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::SetScriptModeFile(pcVar4,pcVar3);
      pcVar4 = ::cm::auto_ptr<cmMakefile>::operator->
                         ((auto_ptr<cmMakefile> *)((long)&file.field_2 + 8));
      cmMakefile::SetArgcArgv(pcVar4,args);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    pcVar4 = ::cm::auto_ptr<cmMakefile>::operator->
                       ((auto_ptr<cmMakefile> *)((long)&file.field_2 + 8));
    bVar1 = cmMakefile::ReadListFile(pcVar4,path);
    if (!bVar1) {
      cmSystemTools::Error("Error processing file: ",path,(char *)0x0,(char *)0x0);
    }
    SetHomeDirectory(this,(string *)local_78);
    SetHomeOutputDirectory(this,(string *)local_a0);
    ::cm::auto_ptr<cmMakefile>::~auto_ptr((auto_ptr<cmMakefile> *)((long)&file.field_2 + 8));
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((bVar5) && (pcStack_28 != (cmGlobalGenerator *)0x0)) {
    (*pcStack_28->_vptr_cmGlobalGenerator[1])();
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const char* path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg) {
    gg = new cmGlobalGenerator(this);
    created = true;
  }

  // read in the list file to fill the cache
  if (path) {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.GetDirectory().SetCurrentSource(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.SetDefaultDefinitions();
    CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(gg, snapshot));
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf->SetScriptModeFile(file.c_str());

      mf->SetArgcArgv(args);
    }
    if (!mf->ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: ", path);
    }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
  }

  // free generic one if generated
  if (created) {
    delete gg;
  }
}